

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int kex_session_ecdh_curve_type(char *name,libssh2_curve_type *out_type)

{
  int iVar1;
  libssh2_curve_type lVar2;
  
  iVar1 = -1;
  if (name != (char *)0x0) {
    iVar1 = strcmp(name,"ecdh-sha2-nistp256");
    if (iVar1 == 0) {
      lVar2 = LIBSSH2_EC_CURVE_NISTP256;
    }
    else {
      iVar1 = strcmp(name,"ecdh-sha2-nistp384");
      if (iVar1 == 0) {
        lVar2 = LIBSSH2_EC_CURVE_NISTP384;
      }
      else {
        iVar1 = strcmp(name,"ecdh-sha2-nistp521");
        if (iVar1 != 0) {
          return -1;
        }
        lVar2 = LIBSSH2_EC_CURVE_NISTP521;
      }
    }
    iVar1 = 0;
    if (out_type != (libssh2_curve_type *)0x0) {
      *out_type = lVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
kex_session_ecdh_curve_type(const char *name, libssh2_curve_type *out_type)
{
    libssh2_curve_type type;

    if(!name)
        return -1;

    if(strcmp(name, "ecdh-sha2-nistp256") == 0)
        type = LIBSSH2_EC_CURVE_NISTP256;
    else if(strcmp(name, "ecdh-sha2-nistp384") == 0)
        type = LIBSSH2_EC_CURVE_NISTP384;
    else if(strcmp(name, "ecdh-sha2-nistp521") == 0)
        type = LIBSSH2_EC_CURVE_NISTP521;
    else {
        return -1;
    }

    if(out_type) {
        *out_type = type;
    }

    return 0;
}